

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object_getOwnPropertyDescriptor
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue getter;
  JSValue getter_00;
  JSValue getter_01;
  JSValue setter;
  JSValue setter_00;
  JSValue setter_01;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSAtom prop;
  int iVar1;
  undefined4 in_register_0000000c;
  ulong uVar2;
  int64_t iVar3;
  JSRefCountHeader *p;
  JSValueUnion JVar4;
  uint uVar5;
  ulong uVar6;
  JSValue v;
  JSValue JVar7;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSPropertyDescriptor desc;
  uint uStack_84;
  uint uStack_74;
  JSPropertyDescriptor local_68;
  
  if (magic == 0) {
    v = JS_ToObject(ctx,*argv);
    if ((int)v.tag == 6) {
      return v;
    }
  }
  else {
    if ((int)argv->tag != -1) {
      JS_ThrowTypeError(ctx,"not an object",this_val.tag,CONCAT44(in_register_0000000c,argc));
      return (JSValue)(ZEXT816(6) << 0x40);
    }
    JVar4 = (JSValueUnion)(argv->u).ptr;
    v.tag = argv->tag;
    v.u.ptr = JVar4.ptr;
    *(int *)JVar4.ptr = *JVar4.ptr + 1;
  }
  JVar4 = v.u;
  prop = JS_ValueToAtom(ctx,argv[1]);
  uVar5 = (uint)v.tag;
  if (prop == 0) goto LAB_0015fa82;
  iVar3 = 3;
  if (uVar5 == 0xffffffff) {
    iVar1 = JS_GetOwnPropertyInternal(ctx,&local_68,(JSObject *)JVar4.ptr,prop);
    if (iVar1 < 0) goto LAB_0015fa82;
    if (iVar1 != 0) {
      JVar7 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
      iVar3 = JVar7.tag;
      if ((int)JVar7.tag != 6) {
        if ((local_68.flags & 0x10U) == 0) {
          val.tag = local_68.value.tag;
          val.u.ptr = local_68.value.u.ptr;
          if (0xfffffff4 < (uint)local_68.value.tag) {
            *(int *)local_68.value.u.ptr = *local_68.value.u.ptr + 1;
          }
          iVar1 = JS_DefinePropertyValue(ctx,JVar7,0x40,val,0x4007);
          if (-1 < iVar1) {
            val_02.u._0_4_ = (uint)local_68.flags >> 1 & 1;
            val_02.u._4_4_ = 0;
            getter.tag = 3;
            getter.u.ptr = (void *)((ulong)uStack_74 << 0x20);
            setter.tag = 3;
            setter.u.ptr = (void *)((ulong)uStack_84 << 0x20);
            val_02.tag = 1;
            iVar1 = JS_DefineProperty(ctx,JVar7,0x3e,val_02,getter,setter,0x6707);
LAB_0015f973:
            if (((-1 < iVar1) &&
                (val_03.u._0_4_ = (uint)local_68.flags >> 2 & 1, val_03.u._4_4_ = 0,
                getter_00.tag = 3, getter_00.u.ptr = (void *)((ulong)uStack_74 << 0x20),
                setter_00.tag = 3, setter_00.u.ptr = (void *)((ulong)uStack_84 << 0x20),
                val_03.tag = 1,
                iVar1 = JS_DefineProperty(ctx,JVar7,0x3f,val_03,getter_00,setter_00,0x6707),
                -1 < iVar1)) &&
               (val_04.u._0_4_ = local_68.flags & 1, val_04.u._4_4_ = 0, getter_01.tag = 3,
               getter_01.u.ptr = (void *)((ulong)uStack_74 << 0x20), setter_01.tag = 3,
               setter_01.u.ptr = (void *)((ulong)uStack_84 << 0x20), val_04.tag = 1,
               iVar1 = JS_DefineProperty(ctx,JVar7,0x3d,val_04,getter_01,setter_01,0x6707),
               -1 < iVar1)) {
              uVar6 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
              js_free_desc(ctx,&local_68);
              uVar2 = (ulong)JVar7.u.ptr & 0xffffffff;
              goto LAB_0015f8cc;
            }
          }
        }
        else {
          val_00.tag = local_68.getter.tag;
          val_00.u.ptr = local_68.getter.u.ptr;
          if (0xfffffff4 < (uint)local_68.getter.tag) {
            *(int *)local_68.getter.u.ptr = *local_68.getter.u.ptr + 1;
          }
          iVar1 = JS_DefinePropertyValue(ctx,JVar7,0x41,val_00,0x4007);
          if (-1 < iVar1) {
            val_01.tag = local_68.setter.tag;
            val_01.u.ptr = local_68.setter.u.ptr;
            if (0xfffffff4 < (uint)local_68.setter.tag) {
              *(int *)local_68.setter.u.ptr = *local_68.setter.u.ptr + 1;
            }
            iVar1 = JS_DefinePropertyValue(ctx,JVar7,0x42,val_01,0x4007);
            goto LAB_0015f973;
          }
        }
      }
      js_object_getOwnPropertyDescriptor_cold_1();
LAB_0015fa82:
      JS_FreeAtom(ctx,prop);
      if ((0xfffffff4 < uVar5) && (iVar1 = *JVar4.ptr, *(int *)JVar4.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,v);
      }
      return (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  uVar2 = 0;
  uVar6 = 0;
LAB_0015f8cc:
  JS_FreeAtom(ctx,prop);
  if ((0xfffffff4 < uVar5) && (iVar1 = *JVar4.ptr, *(int *)JVar4.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,v);
  }
  JVar7.tag = iVar3;
  JVar7.u.ptr = (void *)(uVar6 | uVar2);
  return JVar7;
}

Assistant:

static JSValue js_object_getOwnPropertyDescriptor(JSContext *ctx, JSValueConst this_val,
                                                  int argc, JSValueConst *argv, int magic)
{
    JSValueConst prop;
    JSAtom atom;
    JSValue ret, obj;
    JSPropertyDescriptor desc;
    int res, flags;

    if (magic) {
        /* Reflect.getOwnPropertyDescriptor case */
        if (JS_VALUE_GET_TAG(argv[0]) != JS_TAG_OBJECT)
            return JS_ThrowTypeErrorNotAnObject(ctx);
        obj = JS_DupValue(ctx, argv[0]);
    } else {
        obj = JS_ToObject(ctx, argv[0]);
        if (JS_IsException(obj))
            return obj;
    }
    prop = argv[1];
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        goto exception;
    ret = JS_UNDEFINED;
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        res = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(obj), atom);
        if (res < 0)
            goto exception;
        if (res) {
            ret = JS_NewObject(ctx);
            if (JS_IsException(ret))
                goto exception1;
            flags = JS_PROP_C_W_E | JS_PROP_THROW;
            if (desc.flags & JS_PROP_GETSET) {
                if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_get, JS_DupValue(ctx, desc.getter), flags) < 0
                ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_set, JS_DupValue(ctx, desc.setter), flags) < 0)
                    goto exception1;
            } else {
                if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_value, JS_DupValue(ctx, desc.value), flags) < 0
                ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_writable,
                                           JS_NewBool(ctx, (desc.flags & JS_PROP_WRITABLE) != 0), flags) < 0)
                    goto exception1;
            }
            if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_enumerable,
                                       JS_NewBool(ctx, (desc.flags & JS_PROP_ENUMERABLE) != 0), flags) < 0
            ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_configurable,
                                       JS_NewBool(ctx, (desc.flags & JS_PROP_CONFIGURABLE) != 0), flags) < 0)
                goto exception1;
            js_free_desc(ctx, &desc);
        }
    }
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    return ret;

exception1:
    js_free_desc(ctx, &desc);
    JS_FreeValue(ctx, ret);
exception:
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}